

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CESkyCoord * __thiscall
CESkyCoord::ConvertToObserved(CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CEObserver *in_RDX;
  CEDate *in_RSI;
  CESkyCoord *in_RDI;
  CESkyCoord *unaff_retaddr;
  CEAngle *in_stack_00000018;
  CESkyCoord *in_stack_00000020;
  CEObserver *in_stack_00000028;
  CEDate *in_stack_00000030;
  CESkyCoord *observed;
  CEAngle *in_stack_00000248;
  CESkyCoord *in_stack_00000250;
  CEObserver *in_stack_00000258;
  CEDate *in_stack_00000260;
  CESkyCoord *in_stack_00000268;
  CESkyCoord *in_stack_00000270;
  CESkyCoord *in_stack_ffffffffffffffa8;
  CESkyCoord *this_00;
  CESkyCoord *in_stack_ffffffffffffffd0;
  CEDate *date_00;
  CESkyCoord *out_observed;
  
  this_00 = in_RDI;
  date_00 = in_RSI;
  out_observed = in_RDI;
  CESkyCoord(in_stack_ffffffffffffffd0);
  if (*(int *)&(in_RSI->gregorian_date_vect_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish == 0) {
    CIRS2Observed(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258,
                  in_stack_00000250,in_stack_00000248);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 1) {
    ICRS2Observed((CESkyCoord *)date,(CESkyCoord *)observer,in_stack_00000030,in_stack_00000028,
                  in_stack_00000020,in_stack_00000018);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 2) {
    Galactic2Observed((CESkyCoord *)date,(CESkyCoord *)observer,in_stack_00000030,in_stack_00000028,
                      in_stack_00000020,in_stack_00000018);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 3) {
    SetCoordinates(this_00,in_stack_ffffffffffffffa8);
  }
  else if (*(int *)&(in_RSI->gregorian_date_vect_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish == 4) {
    Ecliptic2Observed(unaff_retaddr,out_observed,date_00,in_RDX);
  }
  return in_RDI;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToObserved(const CEDate&     date,
                                         const CEObserver& observer)
{
    // Create return coordinates
    CESkyCoord observed;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> OBSERVED
        CIRS2Observed(*this, &observed, date, observer);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> OBSERVED
        ICRS2Observed(*this, &observed, date, observer);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> OBSERVED
        Galactic2Observed(*this, &observed, date, observer);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> OBSERVED
        observed.SetCoordinates(*this);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> OBSERVED
        Ecliptic2Observed(*this, &observed, date, observer);
    }
    
    return observed;
}